

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LispLexer.cpp
# Opt level: O0

void __thiscall
Shell::LispLexer::readQuotedString
          (LispLexer *this,Token *token,char opening,char closing,char escapeChar)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  undefined8 uVar4;
  char in_CL;
  undefined4 *in_RSI;
  long in_RDI;
  char in_R8B;
  bool escape;
  Lexer *in_stack_ffffffffffffff58;
  Lexer *in_stack_ffffffffffffff60;
  allocator<char> *in_stack_ffffffffffffff90;
  char *in_stack_ffffffffffffff98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 uVar5;
  undefined4 in_stack_ffffffffffffffb4;
  string *in_stack_ffffffffffffffb8;
  LexerException *in_stack_ffffffffffffffc0;
  
  bVar1 = false;
  while( true ) {
    while( true ) {
      while( true ) {
        bVar2 = Lexer::readNextChar(in_stack_ffffffffffffff58);
        if (!bVar2) {
          uVar4 = __cxa_allocate_exception(0x48);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
          LexerException::LexerException
                    (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
                     (Lexer *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
          __cxa_throw(uVar4,&LexerException::typeinfo,LexerException::~LexerException);
        }
        if (((*(int *)(in_RDI + 8) != (int)in_R8B) || (bVar1)) || (in_CL == in_R8B)) break;
        bVar1 = true;
      }
      if ((*(int *)(in_RDI + 8) != (int)in_CL) || (bVar1)) break;
      if ((in_CL != in_R8B) || (iVar3 = Lexer::lookAhead(in_stack_ffffffffffffff60), iVar3 != in_CL)
         ) {
        Lexer::saveTokenText(in_stack_ffffffffffffff60,(Token *)in_stack_ffffffffffffff58);
        Lexer::readNextChar(in_stack_ffffffffffffff58);
        *in_RSI = 0x18;
        return;
      }
      Lexer::readNextChar(in_stack_ffffffffffffff58);
    }
    if ((bVar1) && ((*(int *)(in_RDI + 8) != (int)in_CL && (*(int *)(in_RDI + 8) != (int)in_R8B))))
    break;
    bVar1 = false;
    Lexer::saveLastChar(in_stack_ffffffffffffff60);
  }
  uVar5 = CONCAT13(1,(int3)in_stack_ffffffffffffffb0);
  uVar4 = __cxa_allocate_exception(0x48);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
  LexerException::LexerException
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
             (Lexer *)CONCAT44(in_stack_ffffffffffffffb4,uVar5));
  __cxa_throw(uVar4,&LexerException::typeinfo,LexerException::~LexerException);
}

Assistant:

void LispLexer::readQuotedString(Token& token, char opening, char closing, char escapeChar)
{
  bool escape=false;
  // Don't save this char so that the final string doesn't contain the quote symbol
  //saveLastChar();

  while (readNextChar()) {
    if (_lastCharacter == escapeChar && !escape && closing != escapeChar) {
      escape=true;
    }
    else if (_lastCharacter == closing && !escape) {
      if(closing == escapeChar && lookAhead() == closing){
        readNextChar();
      }
      else{
        // Don't save this char so that the final string doesn't contain the quote symbol
        //saveLastChar();
        saveTokenText(token);
        readNextChar();
        token.tag = TT_NAME;
        return;
      }
    }
    else {
      if (escape && _lastCharacter!=closing && _lastCharacter!=escapeChar) {
	throw LexerException((std::string)"invalid escape sequence in quoted string ", *this);
      }
      escape=false;
      saveLastChar();
    }
  }
  throw LexerException((std::string)"file ended while reading quoted string ", *this);
}